

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

ProgramContext * __thiscall
deqp::gles3::Performance::InvalidShaderCompilerTextureCase::generateShaderSources
          (ProgramContext *__return_storage_ptr__,InvalidShaderCompilerTextureCase *this,
          int measurementNdx)

{
  InvalidityType IVar1;
  deUint32 cacheAvoidanceID;
  ConditionalType conditionalType;
  ConditionalType in_R8D;
  ConditionalType validity;
  string sStack_68;
  string local_48;
  
  cacheAvoidanceID =
       InvalidShaderCompilerCase::getSpecializationID
                 (&this->super_InvalidShaderCompilerCase,measurementNdx);
  (__return_storage_ptr__->vertShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->vertShaderSource).field_2;
  (__return_storage_ptr__->vertShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->vertShaderSource).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->fragShaderSource)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->fragShaderSource).field_2;
  (__return_storage_ptr__->fragShaderSource)._M_string_length = 0;
  (__return_storage_ptr__->fragShaderSource).field_2._M_local_buf[0] = '\0';
  IVar1 = (this->super_InvalidShaderCompilerCase).m_invalidityType;
  conditionalType = IVar1 == INVALIDITY_SEMANTIC_ERROR ^ CONDITIONAL_TYPE_LAST;
  validity = CONDITIONAL_TYPE_UNIFORM;
  if (IVar1 != INVALIDITY_INVALID_CHAR) {
    validity = conditionalType;
  }
  textureLookupVertexTemplate_abi_cxx11_
            (&sStack_68,(Performance *)(ulong)this->m_conditionalUsage,this->m_conditionalType,
             conditionalType);
  specializeShaderSource(&local_48,&sStack_68,cacheAvoidanceID,validity);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  textureLookupFragmentTemplate_abi_cxx11_
            (&sStack_68,(Performance *)(ulong)(uint)this->m_numLookups,this->m_conditionalUsage,
             this->m_conditionalType,in_R8D);
  specializeShaderSource(&local_48,&sStack_68,cacheAvoidanceID,validity);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::ProgramContext InvalidShaderCompilerTextureCase::generateShaderSources (int measurementNdx) const
{
	deUint32		specID			= getSpecializationID(measurementNdx);
	ProgramContext	result;
	ShaderValidity	shaderValidity	= m_invalidityType == INVALIDITY_INVALID_CHAR	? SHADER_VALIDITY_INVALID_CHAR
									: m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
									: SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	result.vertShaderSource = specializeShaderSource(textureLookupVertexTemplate(m_conditionalUsage, m_conditionalType), specID, shaderValidity);
	result.fragShaderSource = specializeShaderSource(textureLookupFragmentTemplate(m_numLookups, m_conditionalUsage, m_conditionalType), specID, shaderValidity);

	return result;
}